

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObjectPropertyEnumerator.cpp
# Opt level: O2

bool __thiscall
Js::DynamicObjectPropertyEnumerator::Initialize
          (DynamicObjectPropertyEnumerator *this,DynamicObject *object,EnumeratorFlags flags,
          ScriptContext *requestContext,EnumeratorCache *enumeratorCache)

{
  Type TVar1;
  DynamicTypeHandler *pDVar2;
  long *plVar3;
  code *pcVar4;
  undefined8 dynamicType;
  bool bVar5;
  char cVar6;
  int iVar7;
  uint initialPropertyCount;
  BigPropertyIndex initialPropertyCount_00;
  undefined4 *puVar8;
  CachedData *pCVar9;
  Recycler *alloc;
  DynamicType *dynamicType_00;
  ulong uVar10;
  undefined1 local_70 [8];
  TrackAllocData data;
  
  Memory::WriteBarrierPtr<Js::ScriptContext>::WriteBarrierSet(&this->scriptContext,requestContext);
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet(&this->object,object);
  this->flags = flags;
  if (object == (DynamicObject *)0x0) {
    (this->cachedData).ptr = (CachedData *)0x0;
    return true;
  }
  this->objectIndex = -1;
  this->enumeratedCount = 0;
  bVar5 = GetUseCache(this);
  dynamicType_00 = (DynamicType *)(object->super_RecyclableObject).type.ptr;
  if (bVar5) {
    if ((enumeratorCache != (EnumeratorCache *)0x0) &&
       (dynamicType_00 == (DynamicType *)enumeratorCache->type)) {
      pCVar9 = (CachedData *)enumeratorCache->data;
      if (pCVar9 == (CachedData *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObjectPropertyEnumerator.cpp"
                                    ,0x49,"(data != nullptr)","data != nullptr");
        if (!bVar5) goto LAB_00c3c76f;
        *puVar8 = 0;
      }
      if ((pCVar9->scriptContext).ptr != (this->scriptContext).ptr) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObjectPropertyEnumerator.cpp"
                                    ,0x4a,"(data->scriptContext == this->scriptContext)",
                                    "data->scriptContext == this->scriptContext");
        if (!bVar5) {
LAB_00c3c76f:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar8 = 0;
      }
      if ((pCVar9->enumNonEnumerable == (Type)(this->flags & EnumNonEnumerable)) &&
         (pCVar9->enumSymbols == ((this->flags >> 1 & 1) != 0))) {
        initialPropertyCount_00 = pCVar9->propertyCount;
        goto LAB_00c3c759;
      }
    }
    pCVar9 = (CachedData *)
             ThreadContext::GetDynamicObjectEnumeratorCache
                       (requestContext->threadContext,dynamicType_00);
    if ((((pCVar9 != (CachedData *)0x0) &&
         ((pCVar9->scriptContext).ptr == (this->scriptContext).ptr)) &&
        (pCVar9->enumNonEnumerable == (Type)(this->flags & EnumNonEnumerable))) &&
       (pCVar9->enumSymbols == ((this->flags >> 1 & 1) != 0))) {
      Initialize(this,dynamicType_00,pCVar9,pCVar9->propertyCount);
      if (enumeratorCache != (EnumeratorCache *)0x0) {
        enumeratorCache->type = (Type *)dynamicType_00;
        enumeratorCache->data = pCVar9;
        return true;
      }
      return true;
    }
    plVar3 = *(long **)((object->super_RecyclableObject).type.ptr + 1);
    cVar6 = (**(code **)(*plVar3 + 0x80))(plVar3,object);
    if (cVar6 == '\0') {
      return false;
    }
    dynamicType_00 = (DynamicType *)(object->super_RecyclableObject).type.ptr;
    bVar5 = DynamicType::PrepareForTypeSnapshotEnumeration(dynamicType_00);
    if (bVar5) {
      initialPropertyCount = DynamicObject::GetPropertyCountForEnum((this->object).ptr);
      uVar10 = (ulong)initialPropertyCount;
      data.typeinfo = (type_info *)(uVar10 * 0xd);
      local_70 = (undefined1  [8])&CachedData::typeinfo;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_989fc08;
      data.filename._0_4_ = 0x70;
      data._32_8_ = dynamicType_00;
      alloc = Memory::Recycler::TrackAllocInfo(requestContext->recycler,(TrackAllocData *)local_70);
      pCVar9 = (CachedData *)new<Memory::Recycler>(0x30,alloc,0x37ff80,0);
      (pCVar9->scriptContext).ptr = (ScriptContext *)0x0;
      (pCVar9->strings).ptr = (WriteBarrierPtr<Js::PropertyString> *)0x0;
      (pCVar9->indexes).ptr = (int *)0x0;
      (pCVar9->attributes).ptr = (uchar *)0x0;
      Memory::WriteBarrierPtr<Js::ScriptContext>::WriteBarrierSet
                ((WriteBarrierPtr<Js::ScriptContext> *)pCVar9,requestContext);
      pCVar9->cachedCount = 0;
      pCVar9->propertyCount = initialPropertyCount;
      Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<Js::PropertyString>_>::WriteBarrierSet
                (&pCVar9->strings,(WriteBarrierPtr<Js::PropertyString> *)(pCVar9 + 1));
      dynamicType = data._32_8_;
      Memory::WriteBarrierPtr<int>::WriteBarrierSet
                (&pCVar9->indexes,(int *)((pCVar9->strings).ptr + uVar10));
      Memory::WriteBarrierPtr<unsigned_char>::WriteBarrierSet
                (&pCVar9->attributes,(uchar *)((pCVar9->indexes).ptr + uVar10));
      pCVar9->completed = false;
      TVar1 = this->flags;
      pCVar9->enumNonEnumerable = (Type)(TVar1 & EnumNonEnumerable);
      pCVar9->enumSymbols = (Type)(TVar1 >> 1 & 1);
      ThreadContext::AddDynamicObjectEnumeratorCache
                (requestContext->threadContext,(DynamicType *)dynamicType,pCVar9);
      Initialize(this,(DynamicType *)dynamicType,pCVar9,initialPropertyCount);
      if (enumeratorCache != (EnumeratorCache *)0x0) {
        enumeratorCache->type = (Type *)dynamicType;
        enumeratorCache->data = pCVar9;
        return true;
      }
      return true;
    }
    initialPropertyCount_00 =
         (*(object->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
           _vptr_IRecyclerVisitedObject[10])(object);
    pCVar9 = (CachedData *)0x0;
  }
  else {
    pDVar2 = (dynamicType_00->typeHandler).ptr;
    iVar7 = (*pDVar2->_vptr_DynamicTypeHandler[0x10])(pDVar2,object);
    if ((char)iVar7 == '\0') {
      return false;
    }
    dynamicType_00 = (DynamicType *)(object->super_RecyclableObject).type.ptr;
    if ((this->flags & SnapShotSemantics) == None) {
      initialPropertyCount_00 = -1;
    }
    else {
      initialPropertyCount_00 =
           (*(((this->object).ptr)->super_RecyclableObject).super_FinalizableObject.
             super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[10])();
    }
    pCVar9 = (CachedData *)0x0;
  }
LAB_00c3c759:
  Initialize(this,dynamicType_00,pCVar9,initialPropertyCount_00);
  return true;
}

Assistant:

bool DynamicObjectPropertyEnumerator::Initialize(DynamicObject * object, EnumeratorFlags flags, ScriptContext * requestContext, EnumeratorCache * enumeratorCache)
    {
        this->scriptContext = requestContext;
        this->object = object;
        this->flags = flags;

        if (!object)
        {
            this->cachedData = nullptr;
            return true;
        }

        this->objectIndex = Constants::NoBigSlot;
        this->enumeratedCount = 0;

        if (!GetUseCache())
        {
            if (!object->GetDynamicType()->GetTypeHandler()->EnsureObjectReady(object))
            {
                return false;
            }
            Initialize(object->GetDynamicType(), nullptr, GetSnapShotSemantics() ? this->object->GetPropertyCount() : Constants::NoBigSlot);
            return true;
        }

        DynamicType * type = object->GetDynamicType();

        CachedData * data;
        if (enumeratorCache && type == enumeratorCache->type)
        {
            data = (CachedData *)enumeratorCache->data;

            Assert(data != nullptr);
            Assert(data->scriptContext == this->scriptContext); // The cache data script context should be the same as request context

            if (data->enumNonEnumerable == GetEnumNonEnumerable() && data->enumSymbols == GetEnumSymbols())
            {
                Initialize(type, data, data->propertyCount);
                return true;
            }
        }

        data = (CachedData *)requestContext->GetThreadContext()->GetDynamicObjectEnumeratorCache(type);

        if (data != nullptr && data->scriptContext == this->scriptContext && data->enumNonEnumerable == GetEnumNonEnumerable() && data->enumSymbols == GetEnumSymbols())
        {
            Initialize(type, data, data->propertyCount);

            if (enumeratorCache)
            {
                enumeratorCache->type = type;
                enumeratorCache->data = data;
            }
            return true;
        }

        if (!object->GetDynamicType()->GetTypeHandler()->EnsureObjectReady(object))
        {
            return false;
        }

        // Reload the type after EnsureObjectReady
        type = object->GetDynamicType();
        if (!type->PrepareForTypeSnapshotEnumeration())
        {
            Initialize(type, nullptr, object->GetPropertyCount());
            return true;
        }

        uint propertyCount = this->object->GetPropertyCountForEnum();
        data = RecyclerNewStructPlus(requestContext->GetRecycler(),
            propertyCount * sizeof(Field(PropertyString*)) + propertyCount * sizeof(BigPropertyIndex) + propertyCount * sizeof(PropertyAttributes), CachedData);
        data->scriptContext = requestContext;
        data->cachedCount = 0;
        data->propertyCount = propertyCount;
        data->strings = reinterpret_cast<Field(PropertyString*)*>(data + 1);
        data->indexes = unsafe_write_barrier_cast<BigPropertyIndex *>(data->strings + propertyCount);
        data->attributes = (PropertyAttributes*)(data->indexes + propertyCount);
        data->completed = false;
        data->enumNonEnumerable = GetEnumNonEnumerable();
        data->enumSymbols = GetEnumSymbols();
        requestContext->GetThreadContext()->AddDynamicObjectEnumeratorCache(type, data);
        Initialize(type, data, propertyCount);

        if (enumeratorCache)
        {
            enumeratorCache->type = type;
            enumeratorCache->data = data;
        }
        return true;
    }